

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

int message_set_application_properties(MESSAGE_HANDLE message,AMQP_VALUE application_properties)

{
  AMQP_VALUE pAVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  
  if (message == (MESSAGE_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x338;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x338;
    }
    pcVar5 = "NULL message";
    iVar3 = 0x337;
  }
  else {
    if (application_properties == (AMQP_VALUE)0x0) {
      if (message->application_properties == (AMQP_VALUE)0x0) {
        return 0;
      }
      amqpvalue_destroy(message->application_properties);
      message->application_properties = (application_properties)0x0;
      return 0;
    }
    pAVar1 = amqpvalue_clone(application_properties);
    if (pAVar1 != (AMQP_VALUE)0x0) {
      if (message->application_properties != (AMQP_VALUE)0x0) {
        amqpvalue_destroy(message->application_properties);
      }
      message->application_properties = pAVar1;
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x353;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x353;
    }
    pcVar5 = "Cannot clone application properties";
    iVar3 = 0x352;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c",
            "message_set_application_properties",iVar3,1,pcVar5);
  return iVar4;
}

Assistant:

int message_set_application_properties(MESSAGE_HANDLE message, AMQP_VALUE application_properties)
{
    int result;

    if (message == NULL)
    {
        /* Codes_SRS_MESSAGE_01_066: [ If `message` is NULL, `message_set_application_properties` shall fail and return a non-zero value. ]*/
        LogError("NULL message");
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE new_application_properties;

        /* Tests_SRS_MESSAGE_01_149: [ If `application_properties` is NULL, the previously stored application properties associated with `message` shall be freed. ]*/
        if (application_properties == NULL)
        {
            if (message->application_properties != NULL)
            {
                amqpvalue_destroy(message->application_properties);
                message->application_properties = NULL;
            }

            /* Codes_SRS_MESSAGE_01_065: [ On success it shall return 0. ]*/
            result = 0;
        }
        else
        {
            /* Codes_SRS_MESSAGE_01_064: [ `message_set_application_properties` shall copy the contents of `application_properties` as the application properties for the message instance identified by `message`. ]*/
            /* Codes_SRS_MESSAGE_01_067: [ Cloning the message properties shall be done by calling `application_properties_clone`. ]*/
            new_application_properties = application_properties_clone(application_properties);
            if (new_application_properties == NULL)
            {
                /* Codes_SRS_MESSAGE_01_068: [ If `application_properties_clone` fails, `message_set_application_properties` shall fail and return a non-zero value. ]*/
                LogError("Cannot clone application properties");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_MESSAGE_01_069: [ If setting the application properties fails, the previous value shall be preserved. ]*/
                /* Only do the free of the previous value if we could clone the new one*/
                if (message->application_properties != NULL)
                {
                    amqpvalue_destroy(message->application_properties);
                }

                message->application_properties = new_application_properties;

                /* Codes_SRS_MESSAGE_01_065: [ On success it shall return 0. ]*/
                result = 0;
            }
        }
    }

    return result;
}